

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O2

void __thiscall duckdb::ManagedSelection::Initialize(ManagedSelection *this,idx_t new_size)

{
  this->size = new_size;
  SelectionVector::Initialize(&this->sel_vec,new_size);
  OptionalSelection::Initialize(&this->internal_opt_selvec,&this->sel_vec);
  this->initialized = true;
  return;
}

Assistant:

void Initialize(idx_t new_size) {
		D_ASSERT(!initialized);
		this->size = new_size;
		sel_vec.Initialize(new_size);
		internal_opt_selvec.Initialize(&sel_vec);
		initialized = true;
	}